

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  long lVar1;
  char *__rhs;
  FieldDescriptor FVar2;
  CppType CVar3;
  Type TVar4;
  int iVar5;
  iterator iVar6;
  EnumDescriptor *pEVar7;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((byte)field[1] & 8) != 0) {
    lVar1 = *(long *)(*(long *)(field + 0x20) + 8);
    if ((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
        allowed_proto3_extendees_abi_cxx11_ == '\0') {
      iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                                   allowed_proto3_extendees_abi_cxx11_);
      if (iVar5 != 0) {
        this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   *)operator_new(0x30);
        *(undefined4 *)(this_00 + 8) = 0;
        *(undefined8 *)(this_00 + 0x10) = 0;
        *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          **)(this_00 + 0x18) = this_00 + 8;
        *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          **)(this_00 + 0x20) = this_00 + 8;
        *(undefined8 *)(this_00 + 0x28) = 0;
        for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 8) {
          __rhs = *(char **)((long)&DAT_004dcd10 + lVar8);
          std::__cxx11::string::string
                    ((string *)&local_b0,"google.protobuf.",(allocator *)&local_70);
          std::operator+(&local_90,&local_b0,__rhs);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>(this_00,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::string((string *)&local_70,"proto",(allocator *)&local_50);
          std::operator+(&local_b0,&local_70,"2.");
          std::operator+(&local_90,&local_b0,__rhs);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>(this_00,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
        }
        (anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
        allowed_proto3_extendees_abi_cxx11_ =
             &internal::
              OnShutdownDelete<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                        ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_00)->_M_t;
        __cxa_guard_release(&(anonymous_namespace)::
                             AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                             allowed_proto3_extendees_abi_cxx11_);
      }
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                   allowed_proto3_extendees_abi_cxx11_,(key_type *)(lVar1 + 0x20));
    if ((_Rb_tree_header *)iVar6._M_node ==
        &((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
          allowed_proto3_extendees_abi_cxx11_->_M_impl).super__Rb_tree_header) {
      AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,EXTENDEE,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  FVar2 = field[1];
  if (((byte)FVar2 & 0x60) == 0x40) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
             "Required fields are not allowed in proto3.");
    FVar2 = field[1];
  }
  if (((byte)FVar2 & 1) != 0) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 == CPPTYPE_ENUM) {
    pEVar7 = FieldDescriptor::enum_type(field);
    if (pEVar7 != (EnumDescriptor *)0x0) {
      pEVar7 = FieldDescriptor::enum_type(field);
      if (*(char *)(*(long *)(pEVar7 + 0x10) + 0x3a) != '\x03') {
        pEVar7 = FieldDescriptor::enum_type(field);
        if (*(char *)(*(long *)(pEVar7 + 0x10) + 0x3a) != '\0') {
          lVar1 = *(long *)(field + 8);
          pEVar7 = FieldDescriptor::enum_type(field);
          std::operator+(&local_50,"Enum type \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(pEVar7 + 8) + 0x20));
          std::operator+(&local_70,&local_50,"\" is not a proto3 enum, but is used in \"");
          std::operator+(&local_b0,&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(*(long *)(field + 0x20) + 8) + 0x20));
          std::operator+(&local_90,&local_b0,"\" which is a proto3 message type.");
          AddError(this,(string *)(lVar1 + 0x20),&proto->super_Message,TYPE,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
  }
  TVar4 = FieldDescriptor::type(field);
  if (TVar4 == TYPE_GROUP) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
             "Groups are not supported in proto3 syntax.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(FieldDescriptor* field,
                                            const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_PROTO3 &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_UNKNOWN) {
    // Proto3 messages can only use Proto3 enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Enum type \"" + field->enum_type()->full_name() +
                 "\" is not a proto3 enum, but is used in \"" +
                 field->containing_type()->full_name() +
                 "\" which is a proto3 message type.");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}